

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

bool slang::ast::FmtHelpers::checkFinishNum(ASTContext *context,Expression *arg)

{
  SourceRange sourceRange;
  bool bVar1;
  logic_t lVar2;
  logic_t lVar3;
  logic_t lVar4;
  logic_t lVar5;
  byte bVar6;
  SVInt *val;
  ConstantValue cv;
  Expression *in_stack_000002a0;
  ASTContext *in_stack_000002a8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  undefined6 in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  logic_t in_stack_ffffffffffffff27;
  SourceLocation in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  SourceLocation SVar7;
  DiagCode code;
  undefined1 local_1;
  
  code = SUB84((ulong)in_stack_ffffffffffffff30 >> 0x20,0);
  ASTContext::tryEval(in_stack_000002a8,in_stack_000002a0);
  bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa2a5f3);
  if (bVar1) {
    in_stack_ffffffffffffff18 =
         (SourceLocation)slang::ConstantValue::integer((ConstantValue *)0xa2a613);
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffff18;
    SVar7 = in_stack_ffffffffffffff18;
    SVInt::SVInt<int>((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                        CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT15(in_stack_ffffffffffffff05,
                                                          in_stack_ffffffffffffff00))),
                      in_stack_fffffffffffffefc);
    code = SVar7._4_4_;
    in_stack_ffffffffffffff27 =
         SVInt::operator==((SVInt *)in_stack_ffffffffffffff28,
                           (SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,
                                             in_stack_ffffffffffffff20));
    SVInt::SVInt<int>((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                        CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT15(in_stack_ffffffffffffff05,
                                                          in_stack_ffffffffffffff00))),
                      in_stack_fffffffffffffefc);
    lVar2 = SVInt::operator==((SVInt *)in_stack_ffffffffffffff28,
                              (SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,
                                                in_stack_ffffffffffffff20));
    lVar3 = logic_t::operator||((logic_t *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                (logic_t *)0xa2a6c1);
    SVInt::SVInt<int>((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                        CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT15(in_stack_ffffffffffffff05,
                                                          in_stack_ffffffffffffff00))),
                      in_stack_fffffffffffffefc);
    lVar4 = SVInt::operator==((SVInt *)in_stack_ffffffffffffff28,
                              (SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,
                                                in_stack_ffffffffffffff20));
    lVar5 = logic_t::operator||((logic_t *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                (logic_t *)0xa2a71f);
    bVar6 = logic_t::operator_cast_to_bool
                      ((logic_t *)
                       CONCAT17(lVar4.value,
                                CONCAT16(lVar5.value,
                                         CONCAT15(in_stack_ffffffffffffff05,
                                                  in_stack_ffffffffffffff00))));
    SVInt::~SVInt((SVInt *)CONCAT17(lVar2.value,CONCAT16(lVar3.value,in_stack_ffffffffffffff10)));
    SVInt::~SVInt((SVInt *)CONCAT17(lVar2.value,CONCAT16(lVar3.value,in_stack_ffffffffffffff10)));
    SVInt::~SVInt((SVInt *)CONCAT17(lVar2.value,CONCAT16(lVar3.value,in_stack_ffffffffffffff10)));
    if ((bVar6 & 1) != 0) {
      local_1 = true;
      goto LAB_00a2a850;
    }
  }
  sourceRange.startLoc._7_1_ = in_stack_ffffffffffffff27.value;
  sourceRange.startLoc._0_7_ = in_stack_ffffffffffffff20;
  sourceRange.endLoc = in_stack_ffffffffffffff28;
  ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff18,code,sourceRange);
  local_1 = false;
LAB_00a2a850:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa2a85d);
  return local_1;
}

Assistant:

bool FmtHelpers::checkFinishNum(const ASTContext& context, const Expression& arg) {
    ConstantValue cv = context.tryEval(arg);
    if (cv.isInteger()) {
        auto& val = cv.integer();
        if (val == 0 || val == 1 || val == 2)
            return true;
    }

    context.addDiag(diag::BadFinishNum, arg.sourceRange);
    return false;
}